

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_File_read_at_all_begin
              (MPIABI_File fh,MPIABI_Offset offset,void *buf,int count,MPIABI_Datatype datatype)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  ompi_file_t *poVar4;
  ompi_datatype_t *poVar5;
  WPI_Handle<ompi_datatype_t_*> local_40;
  WPI_Handle<ompi_file_t_*> local_38;
  MPIABI_Datatype local_30;
  MPIABI_Datatype datatype_local;
  void *pvStack_20;
  int count_local;
  void *buf_local;
  MPIABI_Offset offset_local;
  MPIABI_File fh_local;
  
  local_30 = datatype;
  datatype_local._4_4_ = count;
  pvStack_20 = buf;
  buf_local = (void *)offset;
  offset_local = fh;
  WPI_Handle<ompi_file_t_*>::WPI_Handle(&local_38,fh);
  poVar4 = WPI_Handle::operator_cast_to_ompi_file_t_((WPI_Handle *)&local_38);
  pvVar2 = buf_local;
  pvVar1 = pvStack_20;
  iVar3 = datatype_local._4_4_;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_40,local_30);
  poVar5 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_40);
  iVar3 = MPI_File_read_at_all_begin(poVar4,pvVar2,pvVar1,iVar3,poVar5);
  return iVar3;
}

Assistant:

int MPIABI_File_read_at_all_begin(
  MPIABI_File fh,
  MPIABI_Offset offset,
  void * buf,
  int count,
  MPIABI_Datatype datatype
) {
  return MPI_File_read_at_all_begin(
    (MPI_File)(WPI_File)fh,
    (MPI_Offset)(WPI_Offset)offset,
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype
  );
}